

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O1

int ON_ParseSettings::Compare(ON_ParseSettings *a,ON_ParseSettings *b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  if (b == (ON_ParseSettings *)0x0 || a == (ON_ParseSettings *)0x0) {
    return -(uint)(b != (ON_ParseSettings *)0x0) | (uint)(a != (ON_ParseSettings *)0x0);
  }
  lVar4 = 0;
  while( true ) {
    uVar1 = a->m_true_default_bits[lVar4];
    uVar2 = b->m_true_default_bits[lVar4];
    if (uVar1 < uVar2) {
      return -1;
    }
    iVar3 = 1;
    if (uVar1 >= uVar2 && uVar1 != uVar2) break;
    lVar4 = lVar4 + 1;
    if (lVar4 != 1) {
      lVar4 = 0;
      while( true ) {
        uVar1 = a->m_false_default_bits[lVar4];
        uVar2 = b->m_false_default_bits[lVar4];
        if (uVar1 < uVar2) {
          return -1;
        }
        if (uVar1 >= uVar2 && uVar1 != uVar2) break;
        lVar4 = lVar4 + 1;
        if (lVar4 != 1) {
          if (a->m_context_locale_id < b->m_context_locale_id) {
            return -1;
          }
          if (a->m_context_locale_id <= b->m_context_locale_id) {
            if (a->m_context_length_unit_system < b->m_context_length_unit_system) {
              return -1;
            }
            if (a->m_context_length_unit_system <= b->m_context_length_unit_system) {
              iVar3 = -1;
              if (b->m_context_angle_unit_system <= a->m_context_angle_unit_system) {
                return (int)(b->m_context_angle_unit_system < a->m_context_angle_unit_system);
              }
            }
          }
          return iVar3;
        }
      }
      return 1;
    }
  }
  return 1;
}

Assistant:

const int ON_ParseSettings::Compare(
  const ON_ParseSettings* a,
  const ON_ParseSettings* b
  )
{
  size_t i;

  if ( 0 == a || 0 == b )
  {
    if ( 0 != b )
      return -1;
    if ( 0 != a )
      return 1;
    return 0;
  }
  
  for ( i = 0; i < sizeof(a->m_true_default_bits)/sizeof(a->m_true_default_bits[0]); i++ )
  {
    if ( a->m_true_default_bits[i] < b->m_true_default_bits[i] )
      return -1;
    if ( b->m_true_default_bits[i] < a->m_true_default_bits[i] )
      return 1;
  }
  
  for ( i = 0; i < sizeof(a->m_false_default_bits)/sizeof(a->m_false_default_bits[0]); i++ )
  {
    if ( a->m_false_default_bits[i] < b->m_false_default_bits[i] )
      return -1;
    if ( b->m_false_default_bits[i] < a->m_false_default_bits[i] )
      return 1;
  }

  if ( a->m_context_locale_id < b->m_context_locale_id )
    return -1;
  if ( b->m_context_locale_id < a->m_context_locale_id )
    return 1;

  if ( a->m_context_length_unit_system < b->m_context_length_unit_system )
    return -1;
  if ( b->m_context_length_unit_system < a->m_context_length_unit_system )
    return 1;

  if ( a->m_context_angle_unit_system < b->m_context_angle_unit_system )
    return -1;
  if ( b->m_context_angle_unit_system < a->m_context_angle_unit_system )
    return 1;

  return 0;
}